

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall
cmTestGenerator::GenerateScriptNoConfig(cmTestGenerator *this,ostream *os,Indent indent)

{
  ostream *poVar1;
  string local_48;
  int local_24;
  ostream *local_20;
  ostream *os_local;
  cmTestGenerator *this_local;
  Indent indent_local;
  
  local_24 = indent.Level;
  local_20 = os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar1 = std::operator<<(poVar1,"add_test(");
  cmTest::GetName_abi_cxx11_(&local_48,this->Test);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  std::operator<<(poVar1," NOT_AVAILABLE)\n");
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptNoConfig(std::ostream& os, Indent indent)
{
  os << indent << "add_test(" << this->Test->GetName() << " NOT_AVAILABLE)\n";
}